

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

OneofOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (OneofOptions *__return_storage_ptr__,OneofDescriptor *descriptor)

{
  OneofDescriptor *descriptor_local;
  
  anon_unknown_0::StripLocalOptions<google::protobuf::OneofDescriptor>
            (__return_storage_ptr__,descriptor);
  return __return_storage_ptr__;
}

Assistant:

OneofOptions StripLocalSourceRetentionOptions(
    const OneofDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}